

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances::CovarianceMatrix::
     verifySize(int NPL,int NPAR)

{
  undefined8 *puVar1;
  char *args;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>("Encountered empty list");
    args = "NPL should be larger than zero and equal to NPAR * ( NPAR + 1 ) / 2";
  }
  else {
    if (NPAR < 1) {
      tools::Log::error<char_const*>("Encountered illegal NPAR value");
      tools::Log::info<char_const*>("NPAR should be larger than zero");
      goto LAB_0011ebaf;
    }
    if ((uint)((NPAR + 1) * NPAR) >> 1 == NPL) {
      return;
    }
    tools::Log::error<char_const*>("Encountered inconsistent list size");
    args = "NPL must be equal to NPAR * ( NPAR + 1 ) / 2";
  }
  tools::Log::info<char_const*>(args);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
LAB_0011ebaf:
  tools::Log::info<char_const*,int>("NPAR value: {}",NPAR);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NPAR ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to NPAR * ( NPAR + 1 ) / 2" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NPAR value: {}", NPAR );
    throw std::exception();
  }

  if ( NPAR < 1 ) {

    Log::error( "Encountered illegal NPAR value" );
    Log::info( "NPAR should be larger than zero" );
    Log::info( "NPAR value: {}", NPAR );
    throw std::exception();
  }

  if ( NPL != NPAR * ( NPAR + 1 ) / 2 ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to NPAR * ( NPAR + 1 ) / 2" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NPAR value: {}", NPAR );
    throw std::exception();
  }
}